

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionBinder::ExpressionBinder
          (ExpressionBinder *this,Binder *binder,ClientContext *context,bool replace_binder)

{
  ExpressionBinder *pEVar1;
  
  this->_vptr_ExpressionBinder = (_func_int **)&PTR__ExpressionBinder_0178d2d0;
  LogicalType::LogicalType(&this->target_type);
  (this->macro_binding).ptr = (DummyBinding *)0x0;
  (this->lambda_bindings).ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
  this->stack_depth = 0xffffffffffffffff;
  this->binder = binder;
  this->context = context;
  (this->stored_binder).ptr = (ExpressionBinder *)0x0;
  (this->bound_columns).
  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>.
  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bound_columns).
  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>.
  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bound_columns).
  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>.
  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitializeStackCheck(this);
  if (replace_binder) {
    pEVar1 = Binder::GetActiveBinder(binder);
    (this->stored_binder).ptr = pEVar1;
    Binder::SetActiveBinder(binder,this);
  }
  else {
    Binder::PushExpressionBinder(binder,this);
  }
  return;
}

Assistant:

ExpressionBinder::ExpressionBinder(Binder &binder, ClientContext &context, bool replace_binder)
    : binder(binder), context(context) {
	InitializeStackCheck();
	if (replace_binder) {
		stored_binder = &binder.GetActiveBinder();
		binder.SetActiveBinder(*this);
	} else {
		binder.PushExpressionBinder(*this);
	}
}